

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O2

err_t SetBlockGroupParent(ebml_master *Element,void *Parent,void *Before)

{
  nodetree *pnVar1;
  ebml_context *Context;
  matroska_block *Block;
  bool_t bVar2;
  mkv_timestamp_t Timestamp;
  mkv_timestamp_t ClusterTimestamp;
  err_t eVar3;
  void *pvVar4;
  
  Context = MATROSKA_getContextBlock();
  Block = (matroska_block *)EBML_MasterFindFirstElt(Element,Context,0,0,0);
  if ((((Block != (matroska_block *)0x0) && (Parent != (void *)0x0)) &&
      (Block->LocalTimestampUsed != 0)) &&
     ((pnVar1 = (Block->Base).Base.Base.Parent, pnVar1 != (nodetree *)0x0 &&
      (pnVar1->Parent != (nodetree *)0x0)))) {
    bVar2 = Node_IsPartOf(Parent,0x55434b4d);
    if (bVar2 == 0) {
      __assert_fail("Node_IsPartOf(Parent,MATROSKA_CLUSTER_CLASS)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x54d,"err_t SetBlockGroupParent(ebml_master *, void *, void *)");
    }
    Timestamp = MATROSKA_BlockTimestamp(Block);
    if (Timestamp == 0x7fffffffffffffff) {
      __assert_fail("AbsTimestamp != INVALID_TIMESTAMP_T",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x54f,"err_t SetBlockGroupParent(ebml_master *, void *, void *)");
    }
    ClusterTimestamp = MATROSKA_ClusterTimestamp((matroska_cluster *)Parent);
    eVar3 = MATROSKA_BlockSetTimestamp(Block,Timestamp,ClusterTimestamp);
    if (eVar3 != 0) {
      return eVar3;
    }
  }
  pvVar4 = Node_InheritedVMT((node *)Element,0x47424b4d);
  eVar3 = (**(code **)((long)pvVar4 + 0x48))(Element,Parent,Before);
  return eVar3;
}

Assistant:

static err_t SetBlockGroupParent(ebml_master *Element, void* Parent, void* Before)
{
    // update the timestamp
    err_t Result = ERR_NONE;
    matroska_block *Block = (matroska_block*)EBML_MasterFindChild(Element, MATROSKA_getContextBlock());
    mkv_timestamp_t AbsTimestamp;
    if (Block && Block->LocalTimestampUsed && Parent && NodeTree_Parent(Block) && NodeTree_Parent(NodeTree_Parent(Block)))
    {
        assert(Node_IsPartOf(Parent,MATROSKA_CLUSTER_CLASS));
        AbsTimestamp = MATROSKA_BlockTimestamp(Block);
        assert(AbsTimestamp != INVALID_TIMESTAMP_T);
        Result = MATROSKA_BlockSetTimestamp(Block,AbsTimestamp,MATROSKA_ClusterTimestamp((matroska_cluster*)Parent));
    }
    if (Result==ERR_NONE)
        Result = INHERITED(Element,nodetree_vmt,MATROSKA_BLOCKGROUP_CLASS)->SetParent(Element, Parent, Before);
    return Result;
}